

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void regul1(qnode_ptr_t f,int n,int sf,float trsh)

{
  disp_vect_t dVar1;
  uint uVar2;
  pos_t loc;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int num;
  pos_t sample [316];
  int local_a44;
  ulong local_a40;
  ulong local_a38;
  double local_a30;
  undefined1 local_a28 [16];
  pos_t local_a18 [317];
  
  iVar3 = f->sizx;
  iVar7 = f->sizy;
  iVar4 = f->ofst;
  iVar5 = iVar4 * 2 + 4;
  iVar6 = (int)((double)(((iVar3 - iVar5) + -4) % n) * 0.5 + 0.5);
  uVar2 = (uint)((double)(((iVar7 - iVar5) + -4) % n) * 0.5 + 0.5);
  local_a38 = (ulong)uVar2;
  KERNEL_X = KERNEL_X + iVar6;
  KERNEL_Y = KERNEL_Y + uVar2;
  local_a40 = (ulong)(iVar6 + 4);
  local_a30 = (double)(float)(double)CONCAT44(in_XMM0_Db,trsh);
  for (iVar5 = iVar4 + uVar2 + 4; iVar5 < (iVar7 - ((int)local_a38 + iVar4)) + -4; iVar5 = iVar5 + n
      ) {
    for (iVar7 = (int)local_a40 + iVar4; iVar7 < ((iVar3 - iVar4) - iVar6) + -4; iVar7 = iVar7 + n)
    {
      min_discr(f,iVar5,iVar7,n,local_a18,&local_a44);
      loc = min_cond(local_a18,f,n,local_a44,SUB84(local_a30,0),sf);
      dVar1 = vector(loc,f);
      local_a28._8_4_ = extraout_XMM0_Dc;
      local_a28._0_4_ = dVar1.x;
      local_a28._4_4_ = dVar1.y;
      local_a28._12_4_ = extraout_XMM0_Dd;
      fVar8 = condition(loc,f);
      fVar9 = determinant(loc,f);
      propagate((disp_vect_t)local_a28._0_8_,SUB84((double)fVar9,0),SUB84((double)fVar8,0),f,iVar5,
                iVar7,n);
      iVar3 = f->sizx;
      iVar4 = f->ofst;
    }
    iVar7 = f->sizy;
  }
  return;
}

Assistant:

void regul1(f,n,sf,trsh)
qnode_ptr_t f ;
int n, sf ;
float trsh ;

{ pos_t min_cond(), sample[X], rep_loc ;
  disp_vect_t vector(), u ;
  float condition(), determinant(), cond_num, det ;
  int num, xf, yf, i, j, k ;

  xf = (int)(((f->sizx-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  yf = (int)(((f->sizy-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  KERNEL_X += xf ;
  KERNEL_Y += yf ;

  for (i = f->ofst+NRADIUS+yf ; i < f->sizy-f->ofst-NRADIUS-yf ; i += n) {
    for (j = f->ofst+NRADIUS+xf ; j < f->sizx-f->ofst-NRADIUS-xf ; j += n) {
      min_discr(f,i,j,n,sample,&num) ;
      rep_loc = min_cond(sample,f,n,num,trsh,sf) ;
      u = vector(rep_loc,f) ;
      cond_num = condition(rep_loc,f) ;
      det = determinant(rep_loc,f) ;
      propagate(u,det,cond_num,f,i,j,n) ;
    }
  }
}